

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromDecimalString
          (IEEEFloat *this,StringRef str,roundingMode rounding_mode)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  uint uVar3;
  int iVar4;
  iterator pcVar5;
  ulong uVar6;
  WordType *dst;
  integerPart *piVar7;
  int iVar8;
  int iVar9;
  bool local_9a;
  ulong local_78;
  integerPart multiplier;
  integerPart val;
  integerPart decValue;
  uint partCount;
  integerPart *decSignificand;
  iterator p;
  undefined1 auStack_40 [4];
  opStatus fs;
  decimalInfo D;
  roundingMode rounding_mode_local;
  IEEEFloat *this_local;
  StringRef str_local;
  
  str_local.Data = (char *)str.Length;
  this_local = (IEEEFloat *)str.Data;
  D.normalizedExponent = rounding_mode;
  decSignificand = (integerPart *)StringRef::begin((StringRef *)&this_local);
  pcVar5 = StringRef::end((StringRef *)&this_local);
  interpretDecimal((iterator)decSignificand,pcVar5,(decimalInfo *)auStack_40);
  pcVar2 = _auStack_40;
  pcVar5 = StringRef::end((StringRef *)&this_local);
  if ((pcVar2 == pcVar5) || (uVar3 = decDigitValue((int)*_auStack_40), 9 < uVar3)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 3;
    p._4_4_ = opOK;
  }
  else if (D.lastSigDigit._4_4_ + -1 < 0xc78c) {
    if ((D.lastSigDigit._4_4_ + -1 < -0xc78b) ||
       (iVar4 = (D.lastSigDigit._4_4_ + 1) * 0x7042,
       iVar8 = (int)this->semantics->minExponent - this->semantics->precision,
       iVar9 = iVar8 * 0x21cb,
       iVar4 == iVar9 || SBORROW4(iVar4,iVar9) != iVar4 + iVar8 * -0x21cb < 0)) {
      this->field_0x12 = this->field_0x12 & 0xf8 | 2;
      zeroSignificand(this);
      p._4_4_ = normalize(this,D.normalizedExponent,lfLessThanHalf);
    }
    else {
      iVar4 = (D.lastSigDigit._4_4_ + -1) * 0xa437;
      iVar8 = (int)this->semantics->maxExponent;
      if (SBORROW4(iVar4,iVar8 * 0x316f) == iVar4 + iVar8 * -0x316f < 0) {
        p._4_4_ = handleOverflow(this,D.normalizedExponent);
      }
      else {
        uVar3 = partCountForBits((uint)((((int)D.firstSigDigit - (int)_auStack_40) + 1) * 0xc4) /
                                 0x3b + 1);
        auVar1 = ZEXT416(uVar3 + 1) * ZEXT816(8);
        uVar6 = auVar1._0_8_;
        if (auVar1._8_8_ != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        dst = (WordType *)operator_new__(uVar6);
        decValue._4_4_ = 0;
        do {
          multiplier = 0;
          local_78 = 1;
          do {
            if ((char)*decSignificand == '.') {
              decSignificand = (integerPart *)((long)decSignificand + 1);
              piVar7 = (integerPart *)StringRef::end((StringRef *)&this_local);
              if (decSignificand == piVar7) break;
            }
            piVar7 = (integerPart *)((long)decSignificand + 1);
            uVar3 = decDigitValue((int)(char)*decSignificand);
            if (9 < (ulong)uVar3) {
              __assert_fail("decValue < 10U && \"Invalid character in significand\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                            ,0x9dc,
                            "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromDecimalString(StringRef, roundingMode)"
                           );
            }
            local_78 = local_78 * 10;
            multiplier = multiplier * 10 + (ulong)uVar3;
            local_9a = piVar7 <= D.firstSigDigit && local_78 < 0x1999999999999999;
            decSignificand = piVar7;
          } while (local_9a);
          APInt::tcMultiplyPart(dst,dst,local_78,multiplier,decValue._4_4_,decValue._4_4_ + 1,false)
          ;
          if (dst[decValue._4_4_] != 0) {
            decValue._4_4_ = decValue._4_4_ + 1;
          }
        } while (decSignificand <= D.firstSigDigit);
        this->field_0x12 = this->field_0x12 & 0xf8 | 2;
        p._4_4_ = roundSignificandWithExponent
                            (this,dst,decValue._4_4_,(int)D.lastSigDigit,D.normalizedExponent);
        if (dst != (WordType *)0x0) {
          operator_delete__(dst);
        }
      }
    }
  }
  else {
    p._4_4_ = handleOverflow(this,D.normalizedExponent);
  }
  return p._4_4_;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromDecimalString(StringRef str, roundingMode rounding_mode) {
  decimalInfo D;
  opStatus fs;

  /* Scan the text.  */
  StringRef::iterator p = str.begin();
  interpretDecimal(p, str.end(), &D);

  /* Handle the quick cases.  First the case of no significant digits,
     i.e. zero, and then exponents that are obviously too large or too
     small.  Writing L for log 10 / log 2, a number d.ddddd*10^exp
     definitely overflows if

           (exp - 1) * L >= maxExponent

     and definitely underflows to zero where

           (exp + 1) * L <= minExponent - precision

     With integer arithmetic the tightest bounds for L are

           93/28 < L < 196/59            [ numerator <= 256 ]
           42039/12655 < L < 28738/8651  [ numerator <= 65536 ]
  */

  // Test if we have a zero number allowing for strings with no null terminators
  // and zero decimals with non-zero exponents.
  //
  // We computed firstSigDigit by ignoring all zeros and dots. Thus if
  // D->firstSigDigit equals str.end(), every digit must be a zero and there can
  // be at most one dot. On the other hand, if we have a zero with a non-zero
  // exponent, then we know that D.firstSigDigit will be non-numeric.
  if (D.firstSigDigit == str.end() || decDigitValue(*D.firstSigDigit) >= 10U) {
    category = fcZero;
    fs = opOK;

  /* Check whether the normalized exponent is high enough to overflow
     max during the log-rebasing in the max-exponent check below. */
  } else if (D.normalizedExponent - 1 > INT_MAX / 42039) {
    fs = handleOverflow(rounding_mode);

  /* If it wasn't, then it also wasn't high enough to overflow max
     during the log-rebasing in the min-exponent check.  Check that it
     won't overflow min in either check, then perform the min-exponent
     check. */
  } else if (D.normalizedExponent - 1 < INT_MIN / 42039 ||
             (D.normalizedExponent + 1) * 28738 <=
               8651 * (semantics->minExponent - (int) semantics->precision)) {
    /* Underflow to zero and round.  */
    category = fcNormal;
    zeroSignificand();
    fs = normalize(rounding_mode, lfLessThanHalf);

  /* We can finally safely perform the max-exponent check. */
  } else if ((D.normalizedExponent - 1) * 42039
             >= 12655 * semantics->maxExponent) {
    /* Overflow and round.  */
    fs = handleOverflow(rounding_mode);
  } else {
    integerPart *decSignificand;
    unsigned int partCount;

    /* A tight upper bound on number of bits required to hold an
       N-digit decimal integer is N * 196 / 59.  Allocate enough space
       to hold the full significand, and an extra part required by
       tcMultiplyPart.  */
    partCount = static_cast<unsigned int>(D.lastSigDigit - D.firstSigDigit) + 1;
    partCount = partCountForBits(1 + 196 * partCount / 59);
    decSignificand = new integerPart[partCount + 1];
    partCount = 0;

    /* Convert to binary efficiently - we do almost all multiplication
       in an integerPart.  When this would overflow do we do a single
       bignum multiplication, and then revert again to multiplication
       in an integerPart.  */
    do {
      integerPart decValue, val, multiplier;

      val = 0;
      multiplier = 1;

      do {
        if (*p == '.') {
          p++;
          if (p == str.end()) {
            break;
          }
        }
        decValue = decDigitValue(*p++);
        assert(decValue < 10U && "Invalid character in significand");
        multiplier *= 10;
        val = val * 10 + decValue;
        /* The maximum number that can be multiplied by ten with any
           digit added without overflowing an integerPart.  */
      } while (p <= D.lastSigDigit && multiplier <= (~ (integerPart) 0 - 9) / 10);

      /* Multiply out the current part.  */
      APInt::tcMultiplyPart(decSignificand, decSignificand, multiplier, val,
                            partCount, partCount + 1, false);

      /* If we used another part (likely but not guaranteed), increase
         the count.  */
      if (decSignificand[partCount])
        partCount++;
    } while (p <= D.lastSigDigit);

    category = fcNormal;
    fs = roundSignificandWithExponent(decSignificand, partCount,
                                      D.exponent, rounding_mode);

    delete [] decSignificand;
  }

  return fs;
}